

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer_allocator.cpp
# Opt level: O2

void __thiscall duckdb::UndoBufferEntry::~UndoBufferEntry(UndoBufferEntry *this)

{
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> _Var1;
  pointer pUVar2;
  type current_next;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> local_20;
  
  _Var1._M_head_impl =
       (this->next).
       super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
       .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (UndoBufferEntry *)0x0) {
    (this->next).
    super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t.
    super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
    .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl = (UndoBufferEntry *)0x0;
    local_20._M_head_impl = _Var1._M_head_impl;
    while (local_20._M_head_impl != (UndoBufferEntry *)0x0) {
      pUVar2 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                             *)&local_20);
      ::std::__uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
      ::operator=((__uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                   *)&local_20,
                  (__uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                   *)&pUVar2->next);
    }
    ::std::unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>::
    ~unique_ptr((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                 *)&local_20);
  }
  ::std::unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>::
  ~unique_ptr(&(this->next).
               super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
             );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->block).internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

UndoBufferEntry::~UndoBufferEntry() {
	if (next) {
		auto current_next = std::move(next);
		while (current_next) {
			current_next = std::move(current_next->next);
		}
	}
}